

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::EntryConcat(RecyclableObject *function,CallInfo callInfo,...)

{
  Type *pTVar1;
  char cVar2;
  ScriptContext *pSVar3;
  JavascriptLibrary *pJVar4;
  _func_int *p_Var5;
  code *pcVar6;
  double value;
  long lVar7;
  uint3 uVar8;
  CallInfo CVar9;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  int32 iVar13;
  uint uVar14;
  undefined4 *puVar15;
  Var pvVar16;
  JavascriptArray *pJVar17;
  int64 iVar18;
  JavascriptNativeIntArray *pJVar19;
  JavascriptNativeFloatArray *fArray;
  uint uVar20;
  undefined4 uVar21;
  TypeId *remoteTypeIds;
  ScriptContext *scriptContext;
  Type ppvVar22;
  uint uVar23;
  ulong uVar24;
  int in_stack_00000010;
  undefined1 *puStack_a0;
  CallInfo local_98;
  CallInfo callInfo_local;
  int local_84;
  undefined1 auStack_80 [4];
  int32 int32Value;
  ArgumentReader args;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  uint local_38;
  RecordOverflowPolicy local_31;
  
  pSVar3 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  puStack_a0 = (undefined1 *)0xa459fe;
  local_98 = callInfo;
  ThreadContext::ProbeStack(pSVar3->threadContext,0xc00,pSVar3,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    puStack_a0 = (undefined1 *)0xa45a12;
    Throw::LogAssert();
    puStack_a0 = (undefined1 *)0xa45a22;
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar15 = 1;
    puStack_a0 = (undefined1 *)0xa45a4a;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                 ,0xe0b,
                                 "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)"
                                 ,"*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo")
    ;
    if (!bVar11) goto LAB_00a46087;
    *puVar15 = 0;
  }
  puStack_a0 = (undefined1 *)0xa45a6d;
  ArgumentReader::ArgumentReader((ArgumentReader *)auStack_80,&local_98,(Var *)&stack0x00000018);
  callInfo_local =
       (CallInfo)
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_60 = *(undefined1 (*) [8])((long)callInfo_local + 0x3b8);
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_60)->noJsReentrancy;
  ((ThreadContext *)local_60)->noJsReentrancy = true;
  if (((ulong)local_98 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    puStack_a0 = (undefined1 *)0xa45ab3;
    Throw::LogAssert();
    puStack_a0 = (undefined1 *)0xa45ac3;
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar15 = 1;
    puStack_a0 = (undefined1 *)0xa45aeb;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                 ,0xe0f,"(!(callInfo.Flags & CallFlags_New))",
                                 "!(callInfo.Flags & CallFlags_New)");
    if (!bVar11) {
LAB_00a46087:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar15 = 0;
  }
  if (((ulong)_auStack_80 & 0xffffff) == 0) {
    puStack_a0 = &LAB_00a4609d;
    JavascriptError::ThrowTypeError
              ((ScriptContext *)callInfo_local,-0x7ff5ec42,L"Array.prototype.concat");
  }
  pSVar3 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  puStack_a0 = (undefined1 *)0xa45b37;
  ThreadContext::ProbeStackNoDispose
            (pSVar3->threadContext,(ulong)(auStack_80 & 0xffffff) * 8 + 0xc00,pSVar3,(PVOID)0x0);
  uVar20 = (auStack_80 & 0xffffff) * 8 + 0xf & 0xfffffff0;
  lVar7 = -(ulong)uVar20;
  remoteTypeIds = (TypeId *)((long)&local_98 + lVar7);
  uVar8 = (uint3)(uVar20 >> 8);
  uVar21 = (undefined4)CONCAT71((uint7)uVar8,1);
  jsReentLock.m_savedNoJsReentrancy = SUB41(uVar21,0);
  jsReentLock._25_3_ = SUB43(uVar21,1);
  ppvVar22 = (Type)0x0;
  uVar24 = 0;
  jsReentLock._29_3_ = uVar8;
  jsReentLock._28_1_ = 1;
  local_38 = 0;
  while( true ) {
    uVar10 = local_38;
    uVar23 = (uint)uVar24;
    uVar20 = jsReentLock._28_4_ & 0xff;
    uVar14 = jsReentLock._24_4_ & 0xff;
    if ((Type)(ulong)(auStack_80 & 0xffffff) <= ppvVar22) break;
    args.super_Arguments.Values = ppvVar22;
    *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45b97;
    pvVar16 = Arguments::operator[]((Arguments *)auStack_80,(int)ppvVar22);
    *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45ba2;
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pvVar16);
    *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45baa;
    bVar11 = DynamicObject::IsAnyArray(pvVar16);
    uVar24 = uVar24 & 0xff;
    if (bVar11) {
      *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45bba;
      pJVar17 = FromAnyArray(pvVar16);
      if ((jsReentLock._24_4_ & 1) != 0) {
        *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45bcb;
        bVar11 = VarIsImpl<Js::JavascriptNativeIntArray>((RecyclableObject *)pJVar17);
        if (!bVar11) {
          *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45bd7;
          bVar11 = VarIsImpl<Js::JavascriptNativeFloatArray>((RecyclableObject *)pJVar17);
          jsReentLock._28_4_ = 0;
          if (!bVar11) {
            uVar14 = 0;
          }
          jsReentLock._24_4_ = uVar14;
        }
      }
      pTVar1 = &(pJVar17->super_ArrayObject).length;
      bVar11 = CARRY4(local_38,*pTVar1);
      local_38 = local_38 + *pTVar1;
      *(undefined8 *)((long)&puStack_a0 + lVar7) = 1;
      ppvVar22 = args.super_Arguments.Values;
      if (bVar11) {
        uVar24 = *(ulong *)((long)&puStack_a0 + lVar7) & 0xffffffff;
      }
    }
    else {
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45c19;
      bVar11 = JavascriptOperators::IsArray(pvVar16);
      *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45c25;
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      ppvVar22 = args.super_Arguments.Values;
      *(bool *)((long)local_60 + 0x108) = true;
      if (bVar11) {
        *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45c3d;
        bVar11 = VarIs<Js::JavascriptProxy>(pvVar16);
        CVar9 = callInfo_local;
        if (!bVar11) {
          cVar2 = *(char *)(*(long *)((long)callInfo_local + 0x1260) + 0x17);
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          if (cVar2 == '\x01') {
            *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45c73;
            pvVar16 = JavascriptOperators::OP_GetLength(pvVar16,(ScriptContext *)CVar9);
            *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45c7e;
            iVar18 = JavascriptConversion::ToLength(pvVar16,(ScriptContext *)CVar9);
            *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45c8a;
            JsReentLock::MutateArrayObject((JsReentLock *)local_60);
            *(bool *)((long)local_60 + 0x108) = true;
            if (0xfffffffe < iVar18) {
              iVar18 = 0xffffffff;
            }
            uVar20 = (uint)iVar18;
          }
          else {
            *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45cdf;
            pvVar16 = JavascriptOperators::OP_GetLength(pvVar16,(ScriptContext *)CVar9);
            *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45cea;
            uVar20 = JavascriptConversion::ToUInt32(pvVar16,(ScriptContext *)CVar9);
            *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45cf6;
            JsReentLock::MutateArrayObject((JsReentLock *)local_60);
            *(bool *)((long)local_60 + 0x108) = true;
          }
          local_38 = local_38 + uVar20;
          *(undefined8 *)((long)&puStack_a0 + lVar7) = 1;
          uVar23 = (uint)uVar24;
          if (CARRY4(uVar10,uVar20)) {
            uVar23 = (uint)*(undefined8 *)((long)&puStack_a0 + lVar7);
          }
        }
        remoteTypeIds[(long)args.super_Arguments.Values] = TypeIds_Array;
        jsReentLock.m_savedNoJsReentrancy = false;
        jsReentLock._25_3_ = 0;
        uVar24 = (ulong)uVar23;
        jsReentLock._28_4_ = 0;
        ppvVar22 = args.super_Arguments.Values;
      }
      else {
        if ((jsReentLock._24_4_ & 1) != 0) {
          *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45cbd;
          bVar11 = BoxConcatItem(pvVar16,(uint)ppvVar22,scriptContext);
          if (bVar11) {
LAB_00a45cc1:
            jsReentLock.m_savedNoJsReentrancy = false;
            jsReentLock._25_3_ = 0;
            jsReentLock._28_4_ = 0;
          }
          else {
            *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45d39;
            bVar11 = TaggedInt::Is(pvVar16);
            if (bVar11) {
              if ((jsReentLock._28_4_ & 1) != 0) {
                *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45d4b;
                iVar13 = TaggedInt::ToInt32(pvVar16);
                if (iVar13 == -0x7fffe) {
                  uVar20 = 0;
                }
LAB_00a45d92:
                jsReentLock._28_4_ = uVar20;
              }
            }
            else {
              if ((ulong)pvVar16 >> 0x32 == 0) goto LAB_00a45cc1;
              if ((jsReentLock._28_4_ & 1) != 0) {
                *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45d75;
                value = JavascriptNumber::GetValue(pvVar16);
                *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45d7e;
                bVar11 = JavascriptNumber::TryGetInt32Value<false>(value,&local_84);
                if (local_84 == -0x7fffe) {
                  uVar20 = 0;
                }
                if (!bVar11) {
                  uVar20 = 0;
                }
                goto LAB_00a45d92;
              }
            }
          }
        }
        ppvVar22 = args.super_Arguments.Values;
        remoteTypeIds[(long)args.super_Arguments.Values] = TypeIds_Limit;
        local_38 = local_38 + 1;
        *(undefined8 *)((long)&puStack_a0 + lVar7) = 1;
        if (local_38 == 0) {
          uVar24 = *(ulong *)((long)&puStack_a0 + lVar7) & 0xffffffff;
        }
      }
    }
    ppvVar22 = (Type)((long)ppvVar22 + 1);
  }
  bVar11 = (uVar24 & 1) != 0;
  if (bVar11) {
    uVar14 = 0;
    uVar20 = 0;
  }
  *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xffffffffffffffff;
  if (bVar11) {
    local_38 = (uint)*(undefined8 *)((long)&puStack_a0 + lVar7);
  }
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  local_31.fOverflow = (bool)(char)uVar24;
  *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45df2;
  pvVar16 = Arguments::operator[]((Arguments *)auStack_80,0);
  CVar9 = callInfo_local;
  *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45e0e;
  pJVar17 = (JavascriptArray *)
            ArraySpeciesCreate<int>
                      (pvVar16,0,(ScriptContext *)CVar9,(bool *)0x0,(bool *)0x0,(bool *)0x0);
  *(bool *)((long)local_60 + 0x108) = true;
  if (pJVar17 == (JavascriptArray *)0x0) {
    if ((uVar20 & 1) == 0) {
      if ((uVar14 & 1) == 0) {
LAB_00a4600d:
        pJVar4 = *(JavascriptLibrary **)((long)CVar9 + 8);
        *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa46019;
        pJVar17 = JavascriptLibrary::CreateArray(pJVar4,local_38);
        goto LAB_00a46019;
      }
LAB_00a45fbc:
      pJVar4 = *(JavascriptLibrary **)((long)CVar9 + 8);
      *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45fc8;
      pJVar17 = (JavascriptArray *)JavascriptLibrary::CreateNativeFloatArray(pJVar4,local_38);
LAB_00a45fc8:
      *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45fd3;
      EnsureHead<double>(pJVar17);
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45ff3;
      ConcatFloatArgs((JavascriptNativeFloatArray *)pJVar17,remoteTypeIds,(Arguments *)auStack_80,
                      (ScriptContext *)CVar9);
      *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45ffc;
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    }
    else {
LAB_00a45f21:
      pJVar4 = *(JavascriptLibrary **)((long)CVar9 + 8);
      *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45f2d;
      pJVar17 = (JavascriptArray *)JavascriptLibrary::CreateNativeIntArray(pJVar4,local_38);
LAB_00a45f2d:
      *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45f38;
      EnsureHead<int>(pJVar17);
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45f58;
      ConcatIntArgs((JavascriptNativeIntArray *)pJVar17,remoteTypeIds,(Arguments *)auStack_80,
                    (ScriptContext *)CVar9);
      *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45f61;
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    }
  }
  else {
    *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45e29;
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pJVar17);
    if ((uVar20 & 1) == 0) {
      if ((uVar14 & 1) == 0) {
        *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45eae;
        bVar11 = VarIsImpl<Js::JavascriptNativeIntArray>((RecyclableObject *)pJVar17);
        if (bVar11) {
          *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45eba;
          pJVar19 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                              ((RecyclableObject *)pJVar17);
          if (pJVar19 != (JavascriptNativeIntArray *)0x0) {
            *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45ec7;
            JavascriptNativeIntArray::ToVarArray(pJVar19);
            goto LAB_00a45f0d;
          }
        }
        *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45ee6;
        bVar11 = VarIsImpl<Js::JavascriptNativeFloatArray>((RecyclableObject *)pJVar17);
        if (bVar11) {
          *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45ef2;
          fArray = UnsafeVarTo<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                             ((RecyclableObject *)pJVar17);
          if (fArray != (JavascriptNativeFloatArray *)0x0) {
            *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45eff;
            JavascriptNativeFloatArray::ToVarArray(fArray);
            goto LAB_00a45f0d;
          }
        }
        *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45f09;
        bVar11 = IsNonES5Array(pJVar17);
      }
      else {
        *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45e8b;
        bVar11 = VarIsImpl<Js::JavascriptNativeIntArray>((RecyclableObject *)pJVar17);
        if (bVar11) {
          *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45e97;
          pJVar19 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                              ((RecyclableObject *)pJVar17);
          if (pJVar19 != (JavascriptNativeIntArray *)0x0) {
            *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45ea4;
            JavascriptNativeIntArray::ToNativeFloatArray(pJVar19);
            goto LAB_00a45f0d;
          }
        }
        *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45ed1;
        bVar11 = VarIsImpl<Js::JavascriptNativeFloatArray>((RecyclableObject *)pJVar17);
        uVar14 = (uint)bVar11;
        *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45edc;
        bVar11 = IsNonES5Array(pJVar17);
      }
      if (bVar11 == false) {
LAB_00a45f7f:
        *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45fa3;
        ConcatArgsCallingHelper
                  ((RecyclableObject *)pJVar17,remoteTypeIds,(Arguments *)auStack_80,
                   (ScriptContext *)CVar9,&local_31);
        *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45fac;
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        *(bool *)((long)local_60 + 0x108) = true;
        goto LAB_00a4606c;
      }
LAB_00a45f0d:
      if ((uVar20 & 1) != 0) {
        if (pJVar17 == (JavascriptArray *)0x0) goto LAB_00a45f21;
        *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45f1f;
        pJVar17 = (JavascriptArray *)
                  VarTo<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                            ((RecyclableObject *)pJVar17);
        goto LAB_00a45f2d;
      }
      if ((uVar14 & 1) != 0) {
        if (pJVar17 == (JavascriptArray *)0x0) goto LAB_00a45fbc;
LAB_00a45f75:
        *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45f7d;
        pJVar17 = (JavascriptArray *)
                  VarTo<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                            ((RecyclableObject *)pJVar17);
        goto LAB_00a45fc8;
      }
      if (pJVar17 == (JavascriptArray *)0x0) goto LAB_00a4600d;
    }
    else {
      *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45e36;
      bVar11 = VarIsImpl<Js::JavascriptNativeIntArray>((RecyclableObject *)pJVar17);
      if (bVar11) goto LAB_00a45f0d;
      *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45e46;
      bVar11 = VarIsImpl<Js::JavascriptNativeFloatArray>((RecyclableObject *)pJVar17);
      *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa45e50;
      bVar12 = IsNonES5Array(pJVar17);
      if (!bVar12) goto LAB_00a45f7f;
      if (bVar11) goto LAB_00a45f75;
    }
    *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa4600b;
    pJVar17 = VarTo<Js::JavascriptArray,Js::RecyclableObject>((RecyclableObject *)pJVar17);
LAB_00a46019:
    *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa46024;
    EnsureHead<void*>(pJVar17);
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa46048;
    ConcatArgsCallingHelper
              ((RecyclableObject *)pJVar17,remoteTypeIds,(Arguments *)auStack_80,
               (ScriptContext *)CVar9,&local_31);
    *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa46051;
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
  }
  *(bool *)((long)local_60 + 0x108) = true;
  p_Var5 = (pJVar17->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
           super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74];
  *(undefined8 *)((long)&puStack_a0 + lVar7) = 0xa46068;
  (*p_Var5)(pJVar17);
LAB_00a4606c:
  ((ThreadContext *)local_60)->noJsReentrancy = (bool)jsReentLock.m_arrayObject2._0_1_;
  return pJVar17;
}

Assistant:

Var JavascriptArray::EntryConcat(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Concat);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.concat"));
        }

        //
        // Compute the destination ScriptArray size:
        // - Each item, flattening only one level if a ScriptArray.
        //

        uint32 cDestLength = 0;
        JavascriptArray * pDestArray = NULL;

        PROBE_STACK_NO_DISPOSE(function->GetScriptContext(), Js::Constants::MinStackDefault + (args.Info.Count * sizeof(TypeId*)));
        TypeId* remoteTypeIds = (TypeId*)_alloca(args.Info.Count * sizeof(TypeId*));

        bool isInt = true;
        bool isFloat = true;
        ::Math::RecordOverflowPolicy destLengthOverflow;
        for (uint idxArg = 0; idxArg < args.Info.Count; idxArg++)
        {
            Var aItem = args[idxArg];
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(aItem);
#endif
            if (DynamicObject::IsAnyArray(aItem)) // Get JavascriptArray or ES5Array length
            {
                JavascriptArray * pItemArray = JavascriptArray::FromAnyArray(aItem);
                if (isFloat)
                {
                    if (!VarIs<JavascriptNativeIntArray>(pItemArray))
                    {
                        isInt = false;
                        if (!VarIs<JavascriptNativeFloatArray>(pItemArray))
                        {
                            isFloat = false;
                        }
                    }
                }
                cDestLength = UInt32Math::Add(cDestLength, pItemArray->GetLength(), destLengthOverflow);
            }
            else // Get remote array or object length
            {
                // We already checked for types derived from JavascriptArray. These are types that should behave like array
                // i.e. proxy to array and remote array.
                JS_REENTRANT(jsReentLock, BOOL isArray = JavascriptOperators::IsArray(aItem));
                if (isArray)
                {
                    // Don't try to preserve nativeness of remote arrays. The extra complexity is probably not
                    // worth it.
                    isInt = false;
                    isFloat = false;
                    if (!VarIs<JavascriptProxy>(aItem))
                    {
                        if (scriptContext->GetConfig()->IsES6ToLengthEnabled())
                        {
                            JS_REENTRANT(jsReentLock,
                                int64 len = JavascriptConversion::ToLength(JavascriptOperators::OP_GetLength(aItem, scriptContext), scriptContext));
                            // clipping to MaxArrayLength will overflow when added to cDestLength which we catch below
                            cDestLength = UInt32Math::Add(cDestLength, len < MaxArrayLength ? (uint32)len : MaxArrayLength, destLengthOverflow);
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock,
                                uint len = JavascriptConversion::ToUInt32(JavascriptOperators::OP_GetLength(aItem, scriptContext), scriptContext));
                            cDestLength = UInt32Math::Add(cDestLength, len, destLengthOverflow);
                        }
                    }
                    remoteTypeIds[idxArg] = TypeIds_Array; // Mark remote array, no matter remote JavascriptArray or ES5Array.
                }
                else
                {
                    if (isFloat)
                    {
                        if (BoxConcatItem(aItem, idxArg, scriptContext))
                        {
                            // A primitive will be boxed, so we have to create a var array for the result.
                            isInt = false;
                            isFloat = false;
                        }
                        else if (!TaggedInt::Is(aItem))
                        {
                            if (!JavascriptNumber::Is(aItem))
                            {
                                isInt = false;
                                isFloat = false;
                            }
                            else if (isInt)
                            {
                                int32 int32Value;
                                if(!JavascriptNumber::TryGetInt32Value(JavascriptNumber::GetValue(aItem), &int32Value) ||
                                    SparseArraySegment<int32>::IsMissingItem(&int32Value))
                                {
                                    isInt = false;
                                }
                            }
                        }
                        else if(isInt)
                        {
                            int32 int32Value = TaggedInt::ToInt32(aItem);
                            if(SparseArraySegment<int32>::IsMissingItem(&int32Value))
                            {
                                isInt = false;
                            }
                        }
                    }

                    remoteTypeIds[idxArg] = TypeIds_Limit;
                    cDestLength = UInt32Math::Add(cDestLength, 1, destLengthOverflow);
                }
            }
        }
        if (destLengthOverflow.HasOverflowed())
        {
            cDestLength = MaxArrayLength;
            isInt = false;
            isFloat = false;
        }

        //
        // Create the destination array
        //
        RecyclableObject* pDestObj = nullptr;
        bool isArray = false;

        JS_REENTRANT_NO_MUTATE(jsReentLock, pDestObj = ArraySpeciesCreate(args[0], 0, scriptContext));

        if (pDestObj)
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(pDestObj);
#endif
            // Check the thing that species create made. If it's a native array that can't handle the source
            // data, convert it. If it's a more conservative kind of array than the source data, indicate that
            // so that the data will be converted on copy.
            if (isInt)
            {
                if (VarIs<JavascriptNativeIntArray>(pDestObj))
                {
                    isArray = true;
                }
                else
                {
                    isInt = false;
                    isFloat = VarIs<JavascriptNativeFloatArray>(pDestObj);
                    isArray = JavascriptArray::IsNonES5Array(pDestObj);
                }
            }
            else if (isFloat)
            {
                JavascriptNativeIntArray *nativeIntArray = JavascriptOperators::TryFromVar<JavascriptNativeIntArray>(pDestObj);
                if (nativeIntArray)
                {
                    JavascriptNativeIntArray::ToNativeFloatArray(nativeIntArray);
                    isArray = true;
                }
                else
                {
                    isFloat = VarIs<JavascriptNativeFloatArray>(pDestObj);
                    isArray = JavascriptArray::IsNonES5Array(pDestObj);
                }
            }
            else
            {
                JavascriptNativeIntArray *nativeIntArray = JavascriptOperators::TryFromVar<Js::JavascriptNativeIntArray>(pDestObj);
                if (nativeIntArray)
                {
                    JavascriptNativeIntArray::ToVarArray(nativeIntArray);
                    isArray = true;
                }
                else
                {
                    JavascriptNativeFloatArray *nativeFloatArray = JavascriptOperators::TryFromVar<Js::JavascriptNativeFloatArray>(pDestObj);
                    if (nativeFloatArray)
                    {
                        JavascriptNativeFloatArray::ToVarArray(nativeFloatArray);
                        isArray = true;
                    }
                    else
                    {
                        isArray = JavascriptArray::IsNonES5Array(pDestObj);
                    }
                }
            }
        }

        if (pDestObj == nullptr || isArray)
        {
            if (isInt)
            {
                JavascriptNativeIntArray *pIntArray = isArray ? VarTo<JavascriptNativeIntArray>(pDestObj) : scriptContext->GetLibrary()->CreateNativeIntArray(cDestLength);
                pIntArray->EnsureHead<int32>();

                JS_REENTRANT(jsReentLock, pDestArray = ConcatIntArgs(pIntArray, remoteTypeIds, args, scriptContext));
            }
            else if (isFloat)
            {
                JavascriptNativeFloatArray *pFArray = isArray ? VarTo<JavascriptNativeFloatArray>(pDestObj) : scriptContext->GetLibrary()->CreateNativeFloatArray(cDestLength);
                pFArray->EnsureHead<double>();

                JS_REENTRANT(jsReentLock, pDestArray = ConcatFloatArgs(pFArray, remoteTypeIds, args, scriptContext));
            }
            else
            {

                pDestArray = isArray ?  VarTo<JavascriptArray>(pDestObj) : scriptContext->GetLibrary()->CreateArray(cDestLength);
                // if the constructor has changed then we no longer specialize for ints and floats
                pDestArray->EnsureHead<Var>();

                JS_REENTRANT(jsReentLock, ConcatArgsCallingHelper(pDestArray, remoteTypeIds, args, scriptContext, destLengthOverflow));
            }

            //
            // Return the new array instance.
            //

#ifdef VALIDATE_ARRAY
            pDestArray->ValidateArray();
#endif

            return pDestArray;
        }

        Assert(pDestObj);
        JS_REENTRANT(jsReentLock, ConcatArgsCallingHelper(pDestObj, remoteTypeIds, args, scriptContext, destLengthOverflow));

        return pDestObj;
        JIT_HELPER_END(Array_Concat);
    }